

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brecovery.cpp
# Opt level: O1

bool anon_unknown.dwarf_1ed09::readData
               (istream *input,vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_> *output)

{
  pthread_mutex_t *ppVar1;
  atomic<unsigned_long> aVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  cx_string<2UL> cVar5;
  int iVar6;
  cx_string<4UL> cVar7;
  size_t sVar8;
  pointer pcVar9;
  SessionWriter *pSVar10;
  __atomic_base<unsigned_long> _Var11;
  Session *pSVar12;
  undefined8 uVar13;
  uint64_t clock;
  long lVar14;
  pointer pcVar15;
  SessionWriter *this;
  pointer pcVar16;
  pointer pcVar17;
  uint64_t uVar18;
  long *in_FS_OFFSET;
  size_type __dnew;
  timespec ts_3;
  uintptr_t session;
  vector<char,_std::allocator<char>_> data;
  vector<char,_std::allocator<char>_> queueBuffer;
  void *sessionptr;
  cx_string<1UL> local_5ba;
  string local_5b8;
  cx_string<1UL> local_58a;
  pointer local_588;
  pointer pcStack_580;
  pointer local_578;
  pointer pcStack_570;
  pointer local_568;
  undefined1 local_558 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  _Alloc_hider local_528;
  pointer local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  _Alloc_hider local_508;
  pointer local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  uint64_t local_4e8;
  _Alloc_hider local_4e0;
  pointer local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  _Alloc_hider local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  size_type local_4a0;
  undefined1 local_498 [8];
  pointer pcStack_490;
  _Alloc_hider local_488;
  size_type local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  _Alloc_hider local_468;
  pointer local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  _Alloc_hider local_448;
  pointer local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  uint64_t local_428;
  _Alloc_hider local_420;
  pointer local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  _Alloc_hider local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  undefined1 local_3d8 [16];
  _Alloc_hider local_3c8;
  size_type local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  _Alloc_hider local_3a8;
  pointer local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  _Alloc_hider local_388;
  pointer local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  uint64_t local_368;
  _Alloc_hider local_360;
  pointer local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  _Alloc_hider local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  SessionWriter *local_320;
  undefined1 local_318 [16];
  _Alloc_hider local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  _Alloc_hider local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  _Alloc_hider local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  uint64_t local_2a8;
  _Alloc_hider local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  _Alloc_hider local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  undefined1 local_260 [16];
  _Alloc_hider local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  _Alloc_hider local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  _Alloc_hider local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  uint64_t local_1f0;
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [16];
  _Alloc_hider local_198;
  char local_188 [16];
  _Alloc_hider local_178;
  char local_168 [16];
  _Alloc_hider local_158;
  char local_148 [16];
  uint64_t local_138;
  _Alloc_hider local_130;
  char local_120 [16];
  _Alloc_hider local_110;
  char local_100 [200];
  size_type local_38;
  
  local_38 = 0;
  std::istream::read((char *)input,(long)&local_38);
  local_4a0 = local_38;
  local_568 = (pointer)0x0;
  local_578 = (pointer)0x0;
  pcStack_570 = (pointer)0x0;
  local_588 = (pointer)0x0;
  pcStack_580 = (pointer)0x0;
  std::istream::read((char *)input,(long)&local_588);
  if (local_578 < local_588) {
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar12 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar12,0x100000,0,&local_5b8);
      _GLOBAL__N_1::readData((_GLOBAL__N_1 *)&local_5b8);
    }
    lVar14 = *in_FS_OFFSET;
    if (0x200 < *(ushort *)(in_FS_OFFSET[-7] + 0x88)) {
      return false;
    }
    if (_ZZN12_GLOBAL__N_120checkQueueInvariantsERN6binlog6detail5QueueEE11_binlog_sid_0 == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar12 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar12,0x100000,0,&local_5b8);
        _GLOBAL__N_1::readData((_GLOBAL__N_1 *)&local_5b8);
      }
      ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_558._16_8_ = &local_538;
      local_558._0_8_ = (pointer)0x0;
      local_558._8_2_ = 0x200;
      local_558._24_8_ = (pointer)0x4;
      local_538._M_allocated_capacity._0_5_ = 0x6e69616d;
      local_528._M_p = (pointer)&local_518;
      local_5b8._M_dataplus._M_p = (pointer)0x14;
      local_528._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_528,(ulong)&local_5b8);
      local_518._M_allocated_capacity = (size_type)local_5b8._M_dataplus._M_p;
      *(undefined8 *)local_528._M_p = 0x6575516b63656863;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._M_p + 8) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._M_p + 9) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._M_p + 10) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._M_p + 0xb) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._M_p + 0xc) = 'v';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._M_p + 0xd) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._M_p + 0xe) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._M_p + 0xf) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._M_p + 0x10) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._M_p + 0x11) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._M_p + 0x12) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._M_p + 0x13) = 's';
      local_520 = local_5b8._M_dataplus._M_p;
      local_528._M_p[(long)local_5b8._M_dataplus._M_p] = '\0';
      local_508._M_p = (pointer)&local_4f8;
      local_5b8._M_dataplus._M_p = (pointer)0x53;
      local_508._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_508,(ulong)&local_5b8);
      _Var3._M_p = local_5b8._M_dataplus._M_p;
      local_4f8._M_allocated_capacity = (size_type)local_5b8._M_dataplus._M_p;
      memcpy(local_508._M_p,
             "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/bin/brecovery.cpp",
             0x53);
      local_500 = _Var3._M_p;
      local_508._M_p[(long)_Var3._M_p] = '\0';
      local_4e8 = 0xa4;
      local_4e0._M_p = (pointer)&local_4d0;
      local_5b8._M_dataplus._M_p = (pointer)0x33;
      local_4e0._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_4e0,(ulong)&local_5b8);
      local_4d0._M_allocated_capacity = (size_type)local_5b8._M_dataplus._M_p;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x20) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x21) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x22) = '=';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x23) = '{';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x24) = '}';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x25) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x26) = '>';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x27) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x28) = 'c';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x29) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x2a) = 'p';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x2b) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x2c) = 'c';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x2d) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x2e) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x2f) = 'y';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x10) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x11) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x12) = 'v';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x13) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x14) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x15) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x16) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x17) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x18) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x19) = 'd';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x1a) = ':';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x1b) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x1c) = 'w';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x1d) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x1e) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x1f) = 't';
      *(undefined8 *)local_4e0._M_p = 0x2065756575512020;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 8) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 9) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 10) = 'v';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0xb) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0xc) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0xd) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0xe) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0xf) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x2f) = 'y';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x30) = '=';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x31) = '{';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_p + 0x32) = '}';
      local_4d8 = local_5b8._M_dataplus._M_p;
      local_4e0._M_p[(long)local_5b8._M_dataplus._M_p] = '\0';
      local_5ba._data[0] = 'L';
      local_5ba._data[1] = '\0';
      local_58a._data[0] = 'L';
      local_58a._data[1] = '\0';
      cVar5 = mserialize::cx_strcat<1ul,1ul>(&local_5ba,&local_58a);
      local_5b8._M_dataplus._M_p._0_1_ = cVar5._data[0];
      local_5b8._M_dataplus._M_p._1_1_ = cVar5._data[1];
      local_5b8._M_dataplus._M_p._2_1_ = cVar5._data[2];
      local_4c0._M_p = (pointer)&local_4b0;
      sVar8 = strlen((char *)&local_5b8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4c0,&local_5b8,(long)&local_5b8._M_dataplus._M_p + sVar8);
      iVar6 = pthread_mutex_lock(ppVar1);
      if (iVar6 != 0) {
        iVar6 = std::__throw_system_error(iVar6);
        goto LAB_0010b7ff;
      }
      local_558._0_8_ = ppVar1[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_558,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
      uVar18 = ppVar1[3].__align;
      ppVar1[3].__align = uVar18 + 1;
      pthread_mutex_unlock(ppVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._M_p != &local_4b0) {
        operator_delete(local_4c0._M_p,local_4b0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0._M_p != &local_4d0) {
        operator_delete(local_4e0._M_p,(ulong)(local_4d0._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_508._M_p != &local_4f8) {
        operator_delete(local_508._M_p,(ulong)(local_4f8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._M_p != &local_518) {
        operator_delete(local_528._M_p,local_518._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._16_8_ != &local_538) {
        operator_delete((void *)local_558._16_8_,local_538._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      _ZZN12_GLOBAL__N_120checkQueueInvariantsERN6binlog6detail5QueueEE11_binlog_sid_0 = uVar18;
    }
    uVar18 = _ZZN12_GLOBAL__N_120checkQueueInvariantsERN6binlog6detail5QueueEE11_binlog_sid_0;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar12 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar12,0x100000,0,&local_5b8);
      _GLOBAL__N_1::readData((_GLOBAL__N_1 *)&local_5b8);
    }
    local_5b8._M_dataplus._M_p = (pointer)0x0;
    local_5b8._M_string_length = 0;
    clock_gettime(0,(timespec *)&local_5b8);
    clock = (long)local_5b8._M_dataplus._M_p * 1000000000 + local_5b8._M_string_length;
    local_5b8._M_dataplus._M_p = local_588;
    goto LAB_0010a2af;
  }
  if (local_578 < pcStack_580) {
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar12 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar12,0x100000,0,&local_5b8);
      _GLOBAL__N_1::readData((_GLOBAL__N_1 *)&local_5b8);
    }
    lVar14 = *in_FS_OFFSET;
    if (0x200 < *(ushort *)(in_FS_OFFSET[-7] + 0x88)) {
      return false;
    }
    if (_ZZN12_GLOBAL__N_120checkQueueInvariantsERN6binlog6detail5QueueEE11_binlog_sid_0_0 != 0) {
LAB_0010a5e3:
      uVar18 = _ZZN12_GLOBAL__N_120checkQueueInvariantsERN6binlog6detail5QueueEE11_binlog_sid_0_0;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar12 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar12,0x100000,0,&local_5b8);
        _GLOBAL__N_1::readData((_GLOBAL__N_1 *)&local_5b8);
      }
      local_5b8._M_dataplus._M_p = (pointer)0x0;
      local_5b8._M_string_length = 0;
      clock_gettime(0,(timespec *)&local_5b8);
      binlog::SessionWriter::addEvent<unsigned_long&,unsigned_long&>
                ((SessionWriter *)(lVar14 + -0x38),uVar18,
                 (long)local_5b8._M_dataplus._M_p * 1000000000 + local_5b8._M_string_length,
                 (unsigned_long *)&pcStack_580,(unsigned_long *)&local_578);
      return false;
    }
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar12 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar12,0x100000,0,&local_5b8);
      _GLOBAL__N_1::readData((_GLOBAL__N_1 *)&local_5b8);
    }
    ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
    local_3c8._M_p = (pointer)&local_3b8;
    local_3d8._0_8_ = (pointer)0x0;
    local_3d8._8_2_ = error;
    local_3b8._M_allocated_capacity._0_4_ = 0x6e69616d;
    local_3c0 = 4;
    local_3b8._M_allocated_capacity._4_4_ = local_3b8._M_allocated_capacity._4_4_ & 0xffffff00;
    local_3a8._M_p = (pointer)&local_398;
    local_5b8._M_dataplus._M_p = (pointer)0x14;
    local_3a8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_3a8,(ulong)&local_5b8)
    ;
    local_398._M_allocated_capacity = (size_type)local_5b8._M_dataplus._M_p;
    *(undefined8 *)local_3a8._M_p = 0x6575516b63656863;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_p + 8) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_p + 9) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_p + 10) = 'I';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_p + 0xb) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_p + 0xc) = 'v';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_p + 0xd) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_p + 0xe) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_p + 0xf) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_p + 0x10) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_p + 0x11) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_p + 0x12) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_p + 0x13) = 's';
    local_3a0 = local_5b8._M_dataplus._M_p;
    local_3a8._M_p[(long)local_5b8._M_dataplus._M_p] = '\0';
    local_388._M_p = (pointer)&local_378;
    local_5b8._M_dataplus._M_p = (pointer)0x53;
    local_388._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_388,(ulong)&local_5b8)
    ;
    _Var3._M_p = local_5b8._M_dataplus._M_p;
    local_378._M_allocated_capacity = (size_type)local_5b8._M_dataplus._M_p;
    memcpy(local_388._M_p,
           "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/bin/brecovery.cpp",
           0x53);
    local_380 = _Var3._M_p;
    local_388._M_p[(long)_Var3._M_p] = '\0';
    local_368 = 0xaa;
    local_360._M_p = (pointer)&local_350;
    local_5b8._M_dataplus._M_p = (pointer)0x34;
    local_360._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_360,(ulong)&local_5b8)
    ;
    local_350._M_allocated_capacity = (size_type)local_5b8._M_dataplus._M_p;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x20) = 'E';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x21) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x22) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x23) = '=';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x24) = '{';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x25) = '}';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x26) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x27) = '>';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x28) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x29) = 'c';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x2a) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x2b) = 'p';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x2c) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x2d) = 'c';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x2e) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x2f) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x10) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x11) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x12) = 'v';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x13) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x14) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x15) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x16) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x17) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x18) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x19) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x1a) = ':';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x1b) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x1c) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x1d) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x1e) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x1f) = 'a';
    *(undefined8 *)local_360._M_p = 0x2065756575512020;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 8) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 9) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 10) = 'v';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0xb) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0xc) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0xd) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0xe) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0xf) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x30) = 'y';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x31) = '=';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x32) = '{';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p + 0x33) = '}';
    local_358 = local_5b8._M_dataplus._M_p;
    local_360._M_p[(long)local_5b8._M_dataplus._M_p] = '\0';
    local_5ba._data[0] = 'L';
    local_5ba._data[1] = '\0';
    local_58a._data[0] = 'L';
    local_58a._data[1] = '\0';
    cVar5 = mserialize::cx_strcat<1ul,1ul>(&local_5ba,&local_58a);
    local_5b8._M_dataplus._M_p._0_1_ = cVar5._data[0];
    local_5b8._M_dataplus._M_p._1_1_ = cVar5._data[1];
    local_5b8._M_dataplus._M_p._2_1_ = cVar5._data[2];
    local_340._M_p = (pointer)&local_330;
    sVar8 = strlen((char *)&local_5b8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_340,&local_5b8,(long)&local_5b8._M_dataplus._M_p + sVar8);
    iVar6 = pthread_mutex_lock(ppVar1);
    if (iVar6 == 0) {
      local_3d8._0_8_ = ppVar1[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_3d8,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
      uVar18 = ppVar1[3].__align;
      ppVar1[3].__align = uVar18 + 1;
      pthread_mutex_unlock(ppVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_p != &local_330) {
        operator_delete(local_340._M_p,local_330._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_p != &local_350) {
        operator_delete(local_360._M_p,(ulong)(local_350._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_p != &local_378) {
        operator_delete(local_388._M_p,(ulong)(local_378._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_p != &local_398) {
        operator_delete(local_3a8._M_p,(ulong)(local_398._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_p != &local_3b8) {
        operator_delete(local_3c8._M_p,
                        CONCAT44(local_3b8._M_allocated_capacity._4_4_,
                                 local_3b8._M_allocated_capacity._0_4_) + 1);
      }
      LOCK();
      UNLOCK();
      _ZZN12_GLOBAL__N_120checkQueueInvariantsERN6binlog6detail5QueueEE11_binlog_sid_0_0 = uVar18;
      goto LAB_0010a5e3;
    }
LAB_0010b7ff:
    iVar6 = std::__throw_system_error(iVar6);
LAB_0010b806:
    iVar6 = std::__throw_system_error(iVar6);
LAB_0010b80d:
    iVar6 = std::__throw_system_error(iVar6);
LAB_0010b814:
    uVar13 = std::__throw_system_error(iVar6);
    if ((undefined1 *)local_558._0_8_ != local_558 + 0x10) {
      operator_delete((void *)local_558._0_8_,(ulong)(local_558._16_8_ + 1));
    }
    if (local_498 != (undefined1  [8])0x0) {
      operator_delete((void *)local_498,(long)local_488._M_p - (long)local_498);
    }
    if ((pointer)local_3d8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_3d8._0_8_,(long)local_3c8._M_p - local_3d8._0_8_);
    }
    _Unwind_Resume(uVar13);
  }
  if (local_578 < local_568) {
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar12 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar12,0x100000,0,&local_5b8);
      _GLOBAL__N_1::readData((_GLOBAL__N_1 *)&local_5b8);
    }
    lVar14 = *in_FS_OFFSET;
    if (0x200 < *(ushort *)(in_FS_OFFSET[-7] + 0x88)) {
      return false;
    }
    if (_ZZN12_GLOBAL__N_120checkQueueInvariantsERN6binlog6detail5QueueEE11_binlog_sid_1_0 == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar12 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar12,0x100000,0,&local_5b8);
        _GLOBAL__N_1::readData((_GLOBAL__N_1 *)&local_5b8);
      }
      ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_488._M_p = (pointer)&local_478;
      local_498 = (undefined1  [8])0x0;
      pcStack_490 = (pointer)CONCAT62(pcStack_490._2_6_,0x200);
      local_478._M_allocated_capacity._0_4_ = 0x6e69616d;
      local_480 = 4;
      local_478._M_allocated_capacity._4_4_ = local_478._M_allocated_capacity._4_4_ & 0xffffff00;
      local_468._M_p = (pointer)&local_458;
      local_5b8._M_dataplus._M_p = (pointer)0x14;
      local_468._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_468,(ulong)&local_5b8);
      local_458._M_allocated_capacity = (size_type)local_5b8._M_dataplus._M_p;
      *(undefined8 *)local_468._M_p = 0x6575516b63656863;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_p + 8) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_p + 9) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_p + 10) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_p + 0xb) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_p + 0xc) = 'v';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_p + 0xd) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_p + 0xe) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_p + 0xf) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_p + 0x10) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_p + 0x11) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_p + 0x12) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_p + 0x13) = 's';
      local_460 = local_5b8._M_dataplus._M_p;
      local_468._M_p[(long)local_5b8._M_dataplus._M_p] = '\0';
      local_448._M_p = (pointer)&local_438;
      local_5b8._M_dataplus._M_p = (pointer)0x53;
      local_448._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_448,(ulong)&local_5b8);
      _Var3._M_p = local_5b8._M_dataplus._M_p;
      local_438._M_allocated_capacity = (size_type)local_5b8._M_dataplus._M_p;
      memcpy(local_448._M_p,
             "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/bin/brecovery.cpp",
             0x53);
      local_440 = _Var3._M_p;
      local_448._M_p[(long)_Var3._M_p] = '\0';
      local_428 = 0xb0;
      local_420._M_p = (pointer)&local_410;
      local_5b8._M_dataplus._M_p = (pointer)0x33;
      local_420._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_420,(ulong)&local_5b8);
      local_410._M_allocated_capacity = (size_type)local_5b8._M_dataplus._M_p;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x20) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x21) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x22) = '=';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x23) = '{';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x24) = '}';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x25) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x26) = '>';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x27) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x28) = 'c';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x29) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x2a) = 'p';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x2b) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x2c) = 'c';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x2d) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x2e) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x2f) = 'y';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x10) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x11) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x12) = 'v';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x13) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x14) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x15) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x16) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x17) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x18) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x19) = 'd';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x1a) = ':';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x1b) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x1c) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x1d) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x1e) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x1f) = 'd';
      *(undefined8 *)local_420._M_p = 0x2065756575512020;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 8) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 9) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 10) = 'v';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0xb) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0xc) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0xd) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0xe) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0xf) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x2f) = 'y';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x30) = '=';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x31) = '{';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_p + 0x32) = '}';
      local_418 = local_5b8._M_dataplus._M_p;
      local_420._M_p[(long)local_5b8._M_dataplus._M_p] = '\0';
      local_5ba._data[0] = 'L';
      local_5ba._data[1] = '\0';
      local_58a._data[0] = 'L';
      local_58a._data[1] = '\0';
      cVar5 = mserialize::cx_strcat<1ul,1ul>(&local_5ba,&local_58a);
      local_5b8._M_dataplus._M_p._0_1_ = cVar5._data[0];
      local_5b8._M_dataplus._M_p._1_1_ = cVar5._data[1];
      local_5b8._M_dataplus._M_p._2_1_ = cVar5._data[2];
      local_400._M_p = (pointer)&local_3f0;
      sVar8 = strlen((char *)&local_5b8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_400,&local_5b8,(long)&local_5b8._M_dataplus._M_p + sVar8);
      iVar6 = pthread_mutex_lock(ppVar1);
      if (iVar6 != 0) goto LAB_0010b806;
      local_498 = (undefined1  [8])ppVar1[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_498,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
      uVar18 = ppVar1[3].__align;
      ppVar1[3].__align = uVar18 + 1;
      pthread_mutex_unlock(ppVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_400._M_p != &local_3f0) {
        operator_delete(local_400._M_p,local_3f0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420._M_p != &local_410) {
        operator_delete(local_420._M_p,(ulong)(local_410._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_p != &local_438) {
        operator_delete(local_448._M_p,(ulong)(local_438._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_p != &local_458) {
        operator_delete(local_468._M_p,(ulong)(local_458._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_p != &local_478) {
        operator_delete(local_488._M_p,
                        CONCAT44(local_478._M_allocated_capacity._4_4_,
                                 local_478._M_allocated_capacity._0_4_) + 1);
      }
      LOCK();
      UNLOCK();
      _ZZN12_GLOBAL__N_120checkQueueInvariantsERN6binlog6detail5QueueEE11_binlog_sid_1_0 = uVar18;
    }
    uVar18 = _ZZN12_GLOBAL__N_120checkQueueInvariantsERN6binlog6detail5QueueEE11_binlog_sid_1_0;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar12 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar12,0x100000,0,&local_5b8);
      _GLOBAL__N_1::readData((_GLOBAL__N_1 *)&local_5b8);
    }
    local_5b8._M_dataplus._M_p = (pointer)0x0;
    local_5b8._M_string_length = 0;
    clock_gettime(0,(timespec *)&local_5b8);
    clock = (long)local_5b8._M_dataplus._M_p * 1000000000 + local_5b8._M_string_length;
    local_5b8._M_dataplus._M_p = local_568;
LAB_0010a2af:
    binlog::SessionWriter::addEvent<unsigned_long,unsigned_long&>
              ((SessionWriter *)(lVar14 + -0x38),uVar18,clock,(unsigned_long *)&local_5b8,
               (unsigned_long *)&local_578);
    return false;
  }
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar12 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar12,0x100000,0,(string *)local_558);
    _GLOBAL__N_1::readData((_GLOBAL__N_1 *)local_558);
  }
  this = (SessionWriter *)(*in_FS_OFFSET + -0x38);
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
    if (readData::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar12 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar12,0x100000,0,(string *)local_558);
        _GLOBAL__N_1::readData((_GLOBAL__N_1 *)local_558);
      }
      ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_260._0_8_ = 0;
      local_260._8_2_ = info;
      local_250._M_p = (pointer)&local_240;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"main","");
      local_230._M_p = (pointer)&local_220;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"readData","");
      local_210._M_p = (pointer)&local_200;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_210,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/bin/brecovery.cpp"
                 ,"");
      local_1f0 = 200;
      local_1e8._M_p = (pointer)&local_1d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,
                 "  Queue state is valid: capacity={} windex={} rindex={} dataend={}","");
      local_3d8._0_2_ = 0x4c;
      local_498._0_2_ = 0x4c;
      local_5b8._M_dataplus._M_p._0_2_ = 0x4c;
      local_5ba._data[0] = 'L';
      local_5ba._data[1] = '\0';
      local_320 = this;
      cVar7 = mserialize::cx_strcat<1ul,1ul,1ul,1ul>
                        ((cx_string<1UL> *)local_3d8,(cx_string<1UL> *)local_498,
                         (cx_string<1UL> *)&local_5b8,&local_5ba);
      local_558[0] = cVar7._data[0];
      local_558[1] = cVar7._data[1];
      local_558[2] = cVar7._data[2];
      local_558[3] = cVar7._data[3];
      local_558[4] = cVar7._data[4];
      local_1c8._M_p = (pointer)&local_1b8;
      sVar8 = strlen(local_558);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1c8,local_558,local_558 + sVar8);
      iVar6 = pthread_mutex_lock(ppVar1);
      if (iVar6 != 0) goto LAB_0010b80d;
      local_260._0_8_ = ppVar1[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_260,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
      _Var11._M_i = ppVar1[3].__align;
      ppVar1[3].__align = _Var11._M_i + 1;
      pthread_mutex_unlock(ppVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_p != &local_1b8) {
        operator_delete(local_1c8._M_p,local_1b8._M_allocated_capacity + 1);
      }
      this = local_320;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_p != &local_1d8) {
        operator_delete(local_1e8._M_p,local_1d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_p != &local_200) {
        operator_delete(local_210._M_p,local_200._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_p != &local_220) {
        operator_delete(local_230._M_p,local_220._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_p != &local_240) {
        operator_delete(local_250._M_p,local_240._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      readData::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var11._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         readData::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar12 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar12,0x100000,0,(string *)local_558);
      _GLOBAL__N_1::readData((_GLOBAL__N_1 *)local_558);
    }
    local_558._0_8_ = (pointer)0x0;
    local_558._8_8_ = 0;
    clock_gettime(0,(timespec *)local_558);
    lVar14 = local_558._0_8_ * 1000000000;
    local_558._0_8_ = local_588;
    local_3d8._0_8_ = local_568;
    binlog::SessionWriter::addEvent<unsigned_long&,unsigned_long,unsigned_long,unsigned_long&>
              (this,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,lVar14 + local_558._8_8_
               ,(unsigned_long *)&local_578,(unsigned_long *)local_558,(unsigned_long *)local_3d8,
               (unsigned_long *)&pcStack_580);
  }
  printLogs();
  pcVar16 = local_578;
  pcVar9 = (pointer)remainingSize(input);
  if (pcVar9 < pcVar16) {
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar12 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar12,0x100000,0,(string *)local_558);
      _GLOBAL__N_1::readData((_GLOBAL__N_1 *)local_558);
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x201) {
      if (readData::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar12 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar12,0x100000,0,(string *)local_558
                    );
          _GLOBAL__N_1::readData((_GLOBAL__N_1 *)local_558);
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_318._0_8_ = 0;
        local_318._8_2_ = error;
        local_308._M_p = (pointer)&local_2f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"main","");
        local_2e8._M_p = (pointer)&local_2d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"readData","");
        local_2c8._M_p = (pointer)&local_2b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/bin/brecovery.cpp"
                   ,"");
        local_2a8 = 0xcd;
        local_2a0._M_p = (pointer)&local_290;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2a0,"  Input doesn\'t have {} bytes","");
        local_558._0_2_ = 0x4c;
        local_280._M_p = (pointer)&local_270;
        sVar8 = strlen(local_558);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,local_558,local_558 + sVar8);
        iVar6 = pthread_mutex_lock(ppVar1);
        if (iVar6 != 0) goto LAB_0010b814;
        local_318._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_318,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var11._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var11._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_p != &local_270) {
          operator_delete(local_280._M_p,local_270._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_p != &local_290) {
          operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_p != &local_2b8) {
          operator_delete(local_2c8._M_p,local_2b8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_p != &local_2d8) {
          operator_delete(local_2e8._M_p,local_2d8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_p != &local_2f8) {
          operator_delete(local_308._M_p,local_2f8._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        readData::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var11._M_i;
      }
      aVar2.super___atomic_base<unsigned_long>._M_i =
           readData::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar12 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar12,0x100000,0,(string *)local_558);
        _GLOBAL__N_1::readData((_GLOBAL__N_1 *)local_558);
      }
      local_558._0_8_ = (pointer)0x0;
      local_558._8_8_ = 0;
      clock_gettime(0,(timespec *)local_558);
      binlog::SessionWriter::addEvent<unsigned_long&>
                (this,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,
                 local_558._0_8_ * 1000000000 + local_558._8_8_,(unsigned_long *)&local_578);
    }
    printLogs();
    return false;
  }
  local_3d8._0_8_ = (pointer)0x0;
  local_3d8._8_8_ = (pointer)0x0;
  local_3c8._M_p = (pointer)0x0;
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)local_3d8,(size_type)local_578);
  std::istream::read((char *)input,local_3d8._0_8_);
  if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 5) != 0) {
    bVar4 = false;
    goto LAB_0010b2a3;
  }
  pcStack_570 = (pointer)local_3d8._0_8_;
  if (local_588 < local_568) {
    pcVar16 = local_588;
    pcVar9 = (pointer)local_3d8._0_8_;
    if (pcStack_580 < local_568 || pcStack_580 + -(long)local_568 == (pointer)0x0)
    goto LAB_0010afce;
    pcVar9 = local_568 + local_3d8._0_8_;
    pcVar15 = local_588;
    pcVar16 = pcStack_580 + -(long)local_568;
    pcVar17 = (pointer)local_3d8._0_8_;
  }
  else {
    pcVar16 = local_588 + -(long)local_568;
    pcVar9 = local_568 + local_3d8._0_8_;
LAB_0010afce:
    pcVar15 = (pointer)0x0;
    pcVar17 = (pointer)0x0;
  }
  local_498 = (undefined1  [8])0x0;
  pcStack_490 = (pointer)0x0;
  local_488._M_p = (pointer)0x0;
  std::vector<char,_std::allocator<char>_>::reserve
            ((vector<char,_std::allocator<char>_> *)local_498,(size_type)(pcVar15 + (long)pcVar16));
  std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
            ((vector<char,std::allocator<char>> *)local_498,pcStack_490,pcVar9,
             pcVar16 + (long)pcVar9);
  std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
            ((vector<char,std::allocator<char>> *)local_498,pcStack_490,pcVar17);
  bVar4 = checkEntryBuffer((vector<char,_std::allocator<char>_> *)local_498);
  if (bVar4) {
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar12 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar12,0x100000,0,(string *)local_558);
      if ((undefined1 *)local_558._0_8_ != local_558 + 0x10) {
        operator_delete((void *)local_558._0_8_,(ulong)(local_558._16_8_ + 1));
      }
      __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (readData::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i == 0) {
        pSVar10 = binlog::default_thread_local_writer();
        pSVar12 = pSVar10->_session;
        local_1a8._0_8_ = 0;
        local_1a8._8_2_ = info;
        local_198._M_p = local_188;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"main","");
        local_178._M_p = local_168;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"readData","");
        local_158._M_p = local_148;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_158,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/bin/brecovery.cpp"
                   ,"");
        local_138 = 0xeb;
        local_130._M_p = local_120;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_130,"  Recovered {} bytes of data from session={}","");
        local_5b8._M_dataplus._M_p._0_2_ = 0x4c;
        local_5ba._data[0] = 'L';
        local_5ba._data[1] = '\0';
        cVar5 = mserialize::cx_strcat<1ul,1ul>((cx_string<1UL> *)&local_5b8,&local_5ba);
        local_558[0] = cVar5._data[0];
        local_558[1] = cVar5._data[1];
        local_558[2] = cVar5._data[2];
        local_110._M_p = local_100;
        sVar8 = strlen(local_558);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,local_558,local_558 + sVar8);
        _Var11._M_i = binlog::Session::addEventSource(pSVar12,(EventSource *)local_1a8);
        binlog::EventSource::~EventSource((EventSource *)local_1a8);
        LOCK();
        UNLOCK();
        readData::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var11._M_i;
      }
      aVar2.super___atomic_base<unsigned_long>._M_i =
           readData::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar12 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar12,0x100000,0,(string *)local_558);
        if ((undefined1 *)local_558._0_8_ != local_558 + 0x10) {
          operator_delete((void *)local_558._0_8_,(ulong)(local_558._16_8_ + 1));
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      local_558._0_8_ = (pointer)0x0;
      local_558._8_8_ = 0;
      clock_gettime(0,(timespec *)local_558);
      lVar14 = local_558._0_8_ * 1000000000;
      local_558._0_8_ = pcStack_490 + -(long)local_498;
      binlog::SessionWriter::addEvent<unsigned_long,unsigned_long_const&>
                (this,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,
                 lVar14 + local_558._8_8_,(unsigned_long *)local_558,&local_4a0);
    }
    printLogs();
    local_558._0_4_ = 1;
    local_558._8_8_ = local_4a0;
    local_558._16_8_ = local_498;
    local_558._24_8_ = pcStack_490;
    local_538._M_allocated_capacity = (size_type)local_488._M_p;
    local_498 = (undefined1  [8])0x0;
    pcStack_490 = (pointer)0x0;
    local_488._M_p = (pointer)0x0;
    std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>::emplace_back<RecoveredBuffer>
              (output,(RecoveredBuffer *)local_558);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._16_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_558._16_8_,local_538._M_allocated_capacity - local_558._16_8_);
    }
  }
  if (local_498 != (undefined1  [8])0x0) {
    operator_delete((void *)local_498,(long)local_488._M_p - (long)local_498);
  }
LAB_0010b2a3:
  if ((pointer)local_3d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_3d8._0_8_,(long)local_3c8._M_p - local_3d8._0_8_);
    return bVar4;
  }
  return bVar4;
}

Assistant:

bool readData(std::istream& input, std::vector<RecoveredBuffer>& output)
{
  // get session ptr as a number
  void* sessionptr = nullptr;
  input.read(reinterpret_cast<char*>(&sessionptr), sizeof(void*));
  const std::uintptr_t session = reinterpret_cast<std::uintptr_t>(sessionptr);

  // get queue with writer and reader positions
  // Depending on the standard/compiler, the assert below is invalid
  // because of the std::atomic inside Queue - but we do not care.
  // static_assert(std::is_trivially_copyable<binlog::detail::Queue>::value, "Queue must be trivial");
  binlog::detail::Queue queue(nullptr, 0);
  input.read(reinterpret_cast<char*>(&queue), sizeof(queue));

  if (! checkQueueInvariants(queue)) { return false; }

  STDERR_INFO("  Queue state is valid: capacity={} windex={} rindex={} dataend={}",
    queue.capacity, queue.writeIndex.load(), queue.readIndex.load(), queue.dataEnd);

  // get queue buffer
  if (queue.capacity > remainingSize(input))
  {
    STDERR_ERROR("  Input doesn't have {} bytes", queue.capacity);
    return false;
  }

  std::vector<char> queueBuffer;
  try
  {
    queueBuffer.resize(queue.capacity);
  }
  catch (const std::bad_alloc&)
  {
    STDERR_ERROR("  Failed to allocate {} bytes for queue data", queue.capacity);
    return false;
  }
  input.read(queueBuffer.data(), std::streamsize(queueBuffer.size()));

  if (! input) { return false; }

  // create a reader, get the unread data from the buffer
  queue.buffer = queueBuffer.data();
  binlog::detail::QueueReader reader(queue);
  const binlog::detail::QueueReader::ReadResult dataview = reader.beginRead();

  std::vector<char> data;
  data.reserve(dataview.size());
  data.insert(data.end(), dataview.buffer1, dataview.buffer1 + dataview.size1);
  data.insert(data.end(), dataview.buffer2, dataview.buffer2 + dataview.size2);

  if (! checkEntryBuffer(data)) { return false; }

  STDERR_INFO("  Recovered {} bytes of data from session={}", data.size(), session);

  output.push_back(RecoveredBuffer{BufferType::Data, session, std::move(data)});
  return true;
}